

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_cleanup.h
# Opt level: O1

void google::protobuf::internal::cleanup::
     arena_destruct_object<google::protobuf::internal::MicroString::StringRep>(void *object)

{
  if (*(long **)((long)object + 0x10) != (long *)((long)object + 0x20)) {
    operator_delete(*(long **)((long)object + 0x10),*(long *)((long)object + 0x20) + 1);
    return;
  }
  return;
}

Assistant:

void arena_destruct_object(void* PROTOBUF_NONNULL object) {
  reinterpret_cast<T*>(object)->~T();
}